

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

int count_ncateg_in_col(int *x,size_t n,int ncat,uchar *buffer)

{
  void *in_RCX;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  int cat;
  int ncat_present;
  size_t ix;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_28;
  
  memset(in_RCX,0,(long)in_EDX);
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    if (-1 < *(int *)(in_RDI + local_28 * 4)) {
      *(undefined1 *)((long)in_RCX + (long)*(int *)(in_RDI + local_28 * 4)) = 1;
    }
  }
  local_2c = 0;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    local_2c = (uint)*(byte *)((long)in_RCX + (long)local_30) + local_2c;
  }
  return local_2c;
}

Assistant:

int count_ncateg_in_col(const int x[], const size_t n, const int ncat, unsigned char buffer[])
{
    memset(buffer, 0, ncat*sizeof(char));
    for (size_t ix = 0; ix < n; ix++)
    {
        if (likely(x[ix] >= 0)) buffer[x[ix]] = true;
    }

    int ncat_present = 0;
    for (int cat = 0; cat < ncat; cat++)
        ncat_present += buffer[cat];
    return ncat_present;
}